

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O2

void __thiscall
tchecker::typed_local_var_statement_t::typed_local_var_statement_t
          (typed_local_var_statement_t *this,statement_type_t type,
          shared_ptr<const_tchecker::typed_var_expression_t> *variable)

{
  shared_ptr<const_tchecker::var_expression_t> sStack_28;
  
  *(undefined ***)&this->super_typed_statement_t = &PTR__typed_statement_t_0022c190;
  (this->super_typed_statement_t)._type = type;
  std::__shared_ptr<tchecker::var_expression_t_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::typed_var_expression_t_const,void>
            ((__shared_ptr<tchecker::var_expression_t_const,(__gnu_cxx::_Lock_policy)2> *)&sStack_28
             ,&variable->
               super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>
            );
  local_var_statement_t::local_var_statement_t
            (&this->super_local_var_statement_t,&PTR_construction_vtable_56__0022b240,&sStack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_28.
              super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  *(undefined8 *)&this->super_typed_statement_t = 0x22b188;
  *(undefined8 *)&this->super_local_var_statement_t = 0x22b1f8;
  return;
}

Assistant:

typed_local_var_statement_t::typed_local_var_statement_t(
    enum tchecker::statement_type_t type, std::shared_ptr<tchecker::typed_var_expression_t const> const & variable)
    : tchecker::typed_statement_t(type), tchecker::local_var_statement_t(variable)
{
}